

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O1

ComponentHandle<Tag,_entityx::EntityManager> __thiscall
entityx::EntityManager::assign<Tag,char_const(&)[4]>(EntityManager *this,Id id,char (*args) [4])

{
  long *plVar1;
  ulong *puVar2;
  long lVar3;
  ComponentHandle<Tag,_entityx::EntityManager> CVar4;
  Family FVar5;
  Pool<Tag,_8192UL> *pPVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  ComponentHandle<Tag,_entityx::EntityManager> component;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  Entity local_50;
  ComponentHandle<Tag,_entityx::EntityManager> local_40;
  
  FVar5 = Component<Tag>::family();
  pPVar6 = accomodate_component<Tag>(this);
  uVar7 = id.id_ & 0xffffffff;
  lVar9 = (uVar7 % *(ulong *)&pPVar6->field_0x28) * *(long *)&pPVar6->field_0x20;
  lVar3 = *(long *)(*(long *)&pPVar6->field_0x8 + (uVar7 / *(ulong *)&pPVar6->field_0x28) * 8);
  local_70 = local_60;
  sVar8 = strlen(*args);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,args,*args + sVar8);
  plVar1 = (long *)(lVar3 + lVar9);
  *plVar1 = (long)(plVar1 + 2);
  std::__cxx11::string::_M_construct<char*>((string *)(lVar3 + lVar9),local_70,local_70 + local_68);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (FVar5 < 0x40) {
    puVar2 = (ulong *)(*(long *)(this + 0x48) + uVar7 * 8);
    *puVar2 = *puVar2 | 1L << ((byte)FVar5 & 0x3f);
    local_50.manager_ = this;
    local_50.id_.id_ = id.id_;
    local_40.manager_ = this;
    local_40.id_.id_ = id.id_;
    EventManager::
    emit<entityx::ComponentAddedEvent<Tag>,entityx::Entity,entityx::ComponentHandle<Tag,entityx::EntityManager>&>
              (*(EventManager **)(this + 0x10),&local_50,&local_40);
    CVar4.id_.id_ = local_40.id_.id_;
    CVar4.manager_ = local_40.manager_;
    return CVar4;
  }
  std::__throw_out_of_range_fmt
            ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",FVar5,0x40);
}

Assistant:

ComponentHandle<C> assign(Entity::Id id, Args && ... args) {
    assert_valid(id);
    const BaseComponent::Family family = component_family<C>();
    assert(!entity_component_mask_[id.index()].test(family));

    // Placement new into the component pool.
    Pool<C> *pool = accomodate_component<C>();
    ::new(pool->get(id.index())) C(std::forward<Args>(args) ...);

    // Set the bit for this component.
    entity_component_mask_[id.index()].set(family);

    // Create and return handle.
    ComponentHandle<C> component(this, id);
    event_manager_.emit<ComponentAddedEvent<C>>(Entity(this, id), component);
    return component;
  }